

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O0

bigint<13> * __thiscall bigint<13>::rshift<13>(bigint<13> *this,bigint<13> *x,int n)

{
  ushort uVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  int local_30;
  digit tmp;
  int i;
  digit carry;
  int dig;
  int n_local;
  bigint<13> *x_local;
  bigint<13> *this_local;
  
  if ((this->len != 0) && (n != 0)) {
    iVar2 = (n + -1) / 0x10;
    iVar4 = (n + -1) % 0x10 + 1;
    bVar3 = (byte)iVar4;
    tmp = (digit)((int)(uint)x->digits[iVar2] >> (bVar3 & 0x1f));
    for (local_30 = 0; local_30 < (this->len - iVar2) + -1; local_30 = local_30 + 1) {
      uVar1 = x->digits[local_30 + iVar2 + 1];
      this->digits[local_30] = uVar1 << (0x10 - bVar3 & 0x1f) | tmp;
      tmp = (digit)((int)(uint)uVar1 >> (bVar3 & 0x1f));
    }
    this->digits[(this->len - iVar2) + -1] = tmp;
    this->len = this->len - (iVar2 + (iVar4 >> 0x10));
    shrink(this);
  }
  return this;
}

Assistant:

bigint &rshift(const bigint<X_DIGITS> &x, int n)
    {
        if(!len || !n) return *this;
        int dig = (n-1)/BI_DIGIT_BITS;
        n = ((n-1) % BI_DIGIT_BITS)+1;
        digit carry = digit(x.digits[dig]>>n);
        loopi(len-dig-1)
        {
            digit tmp = x.digits[i+dig+1];
            digits[i] = digit((tmp<<(BI_DIGIT_BITS-n)) | carry);
            carry = digit(tmp>>n);
        }
        digits[len-dig-1] = carry;
        len -= dig + (n>>BI_DIGIT_BITS);
        shrink();
        return *this;
    }